

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::Encode(LinearSegmentParameter *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  LinearSegmentParameter *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui8SegNum);
  pKVar1 = KDataStream::operator<<(pKVar1,(this->m_ModificationUnion).m_ui8Modifications);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_ObjApr);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Loc).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Ori).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Length);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Width);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Height);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Depth);
  KDataStream::operator<<(pKVar1,this->m_ui32Padding);
  return;
}

Assistant:

void LinearSegmentParameter::Encode( KDataStream & stream ) const
{
    stream << m_ui8SegNum
           << m_ModificationUnion.m_ui8Modifications
           << KDIS_STREAM m_ObjApr
           << KDIS_STREAM m_Loc
           << KDIS_STREAM m_Ori
           << m_ui16Length
           << m_ui16Width
           << m_ui16Height
           << m_ui16Depth
           << m_ui32Padding;
}